

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Progress.cpp
# Opt level: O1

void __thiscall Progress::renderStyleMono(Progress *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  size_type sVar5;
  undefined1 uVar6;
  int iVar7;
  time_t tVar8;
  ostream *poVar9;
  string *psVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  Progress *in_RSI;
  uint uVar14;
  double dVar15;
  string estimate_time;
  string elapsed_time;
  string local_90;
  string local_70;
  char *local_50;
  long local_48;
  char local_40;
  undefined7 uStack_3f;
  
  lVar2 = this->current;
  lVar3 = this->minimum;
  lVar4 = this->maximum;
  tVar8 = time((time_t *)0x0);
  local_50 = &local_40;
  local_48 = 0;
  local_40 = '\0';
  if ((this->elapsed == true) && (this->start != 0)) {
    formatTime_abi_cxx11_(&local_90,in_RSI,tVar8 - this->start);
    in_RSI = (Progress *)&local_90;
    std::__cxx11::string::operator=((string *)&local_50,(string *)in_RSI);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      in_RSI = (Progress *)
               (CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                         local_90.field_2._M_local_buf[0]) + 1);
      operator_delete(local_90._M_dataplus._M_p,(ulong)in_RSI);
    }
  }
  dVar15 = (double)(lVar2 - lVar3) / (double)(lVar4 - lVar3);
  paVar1 = &local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)paVar1;
  if ((this->estimate == true) && (this->start != 0)) {
    if (1e-06 <= dVar15) {
      formatTime_abi_cxx11_
                (&local_70,in_RSI,
                 (long)(int)(((1.0 - dVar15) * (double)(tVar8 - this->start)) / dVar15));
    }
    else {
      formatTime_abi_cxx11_(&local_70,in_RSI,0);
    }
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_) !=
        &local_70.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_),
                      local_70.field_2._M_allocated_capacity + 1);
    }
  }
  sVar5 = (this->label)._M_string_length;
  iVar12 = -6;
  if (this->percentage == false) {
    iVar12 = -1;
  }
  iVar11 = (int)sVar5;
  if (sVar5 == 0) {
    iVar11 = -1;
  }
  iVar13 = -1;
  if (this->elapsed != false) {
    iVar13 = (int)local_48;
  }
  iVar7 = -1;
  if (this->estimate != false) {
    iVar7 = (int)local_90._M_string_length;
  }
  iVar12 = ((iVar12 + this->width) - (iVar11 + iVar13 + iVar7)) + -2;
  if (0 < iVar12) {
    if (sVar5 != 0) {
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(this->label)._M_dataplus._M_p,sVar5);
      local_70._M_dataplus._M_p._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_70,1);
    }
    uVar14 = (uint)((double)iVar12 * dVar15);
    if (0 < (int)uVar14) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[47m",5);
      lVar2 = *(long *)(std::cout + -0x18);
      if (*(char *)(lVar2 + 0x10a1d1) == '\0') {
        uVar6 = std::ios::widen((char)lVar2 + -0x10);
        *(undefined1 *)(lVar2 + 0x10a1d0) = uVar6;
        *(undefined1 *)(lVar2 + 0x10a1d1) = 1;
      }
      *(undefined1 *)(lVar2 + 0x10a1d0) = 0x20;
      *(ulong *)(ioctl + *(long *)(std::cout + -0x18)) = (ulong)uVar14;
      local_70._M_dataplus._M_p._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_70,1);
    }
    if (iVar12 - uVar14 != 0 && (int)uVar14 <= iVar12) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[40m",5);
      lVar2 = *(long *)(std::cout + -0x18);
      if (*(char *)(lVar2 + 0x10a1d1) == '\0') {
        uVar6 = std::ios::widen((char)lVar2 + -0x10);
        *(undefined1 *)(lVar2 + 0x10a1d0) = uVar6;
        *(undefined1 *)(lVar2 + 0x10a1d1) = 1;
      }
      *(undefined1 *)(lVar2 + 0x10a1d0) = 0x20;
      *(ulong *)(ioctl + *(long *)(std::cout + -0x18)) = (ulong)(iVar12 - uVar14);
      local_70._M_dataplus._M_p._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_70,1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[0m",4);
    if (this->percentage == true) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      lVar2 = *(long *)(std::cout + -0x18);
      if (*(char *)(lVar2 + 0x10a1d1) == '\0') {
        uVar6 = std::ios::widen((char)lVar2 + -0x10);
        *(undefined1 *)(lVar2 + 0x10a1d0) = uVar6;
        *(undefined1 *)(lVar2 + 0x10a1d1) = 1;
      }
      *(undefined1 *)(lVar2 + 0x10a1d0) = 0x20;
      *(undefined8 *)(ioctl + *(long *)(std::cout + -0x18)) = 3;
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)(dVar15 * 100.0));
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"%",1);
    }
    if ((this->elapsed == true) && (this->start != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_50,local_48);
    }
    if ((this->estimate == true) && (this->start != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,local_90._M_dataplus._M_p,local_90._M_string_length);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\r",1);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    return;
  }
  psVar10 = (string *)__cxa_allocate_exception(0x20);
  *(string **)psVar10 = psVar10 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>(psVar10,"The specified width is insufficient.","")
  ;
  __cxa_throw(psVar10,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void Progress::renderStyleMono ()
{
  // Fraction completed.
  double fraction = (1.0 * (current - minimum)) / (maximum - minimum);

  // Elapsed time.
  time_t now = time (NULL);
  std::string elapsed_time;
  if (elapsed && start != 0)
    elapsed_time = formatTime (now - start);

  // Estimated remaining time.
  std::string estimate_time;
  if (estimate && start != 0)
  {
    if (fraction >= 1e-6)
      estimate_time = formatTime ((time_t) (int) (((now - start) * (1.0 - fraction)) / fraction));
    else
      estimate_time = formatTime (0);
  }

  // Calculate bar width.
  int bar = width
          - (label.length () ? label.length () + 1         : 0)
          - (percentage      ? 5                           : 0)
          - (elapsed         ? elapsed_time.length () + 1  : 0)
          - (estimate        ? estimate_time.length () + 1 : 0);

  if (bar < 1)
    throw std::string ("The specified width is insufficient.");

  int visible = (int) (fraction * bar);

  // Render.
  if (label.length ())
    std::cout << label
              << ' ';

  if (visible > 0)
    std::cout << "\033[47m" // White
              << std::setfill (' ')
              << std::setw (visible)
              << ' ';

  if (bar - visible > 0)
    std::cout << "\033[40m" // Black
              << std::setfill (' ')
              << std::setw (bar - visible)
              << ' ';

  std::cout << "\033[0m";

  if (percentage)
    std::cout << " "
              << std::setfill (' ')
              << std::setw (3)
              << (int) (fraction * 100)
              << "%";

  if (elapsed && start != 0)
    std::cout << " "
              << elapsed_time;

  if (estimate && start != 0)
    std::cout << " "
              << estimate_time;

  std::cout << "\r"
            << std::flush;
}